

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
tinyusdz::to_codepoints
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *str)

{
  size_t i;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t char_len;
  uint32_t cp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cps;
  uint local_50;
  uint32_t local_4c;
  pointer local_48;
  iterator iStack_40;
  pointer local_38;
  
  local_48 = (pointer)0x0;
  iStack_40._M_current = (pointer)0x0;
  local_38 = (pointer)0x0;
  uVar1 = 0;
  do {
    if (str->_M_string_length <= uVar1) {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = local_48;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = iStack_40._M_current;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
      local_48 = (pointer)0x0;
      iStack_40._M_current = (pointer)0x0;
      local_38 = (pointer)0x0;
      break;
    }
    local_4c = detail::to_codepoint((str->_M_dataplus)._M_p + uVar1,&local_50);
    bVar2 = local_4c < 0x110000;
    bVar3 = local_50 != 0;
    if (bVar3 && bVar2) {
      if (iStack_40._M_current == local_38) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,iStack_40,
                   &local_4c);
      }
      else {
        *iStack_40._M_current = local_4c;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      uVar1 = uVar1 + local_50;
    }
    else {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
  } while (bVar3 && bVar2);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> to_codepoints(const std::string &str) {

  std::vector<uint32_t> cps;

  for (size_t i = 0; i < str.size(); ) {
    uint32_t char_len;
    uint32_t cp = detail::to_codepoint(str.c_str() + i, char_len);

    if ((cp > kMaxUTF8Codepoint) || (char_len == 0)) {
      return std::vector<uint32_t>();
    }

    cps.push_back(cp);

    i += char_len;
  }

  return cps;
}